

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::word_clear(jpeg_decoder *this,void *p,uint16 c,uint n)

{
  uint8 h;
  uint8 l;
  uint8 *pD;
  uint n_local;
  uint16 c_local;
  void *p_local;
  jpeg_decoder *this_local;
  
  pD = (uint8 *)p;
  for (n_local = n; n_local != 0; n_local = n_local - 1) {
    *(uint16 *)pD = c;
    pD = pD + 2;
  }
  return;
}

Assistant:

void jpeg_decoder::word_clear(void* p, uint16 c, uint n) {
  uint8* pD = (uint8*)p;
  const uint8 l = c & 0xFF, h = (c >> 8) & 0xFF;
  while (n) {
    pD[0] = l;
    pD[1] = h;
    pD += 2;
    n--;
  }
}